

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

int64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_sint64
                  (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  protobuf_test_messages_proto2_TestAllTypesProto2 *to;
  upb_MiniTableField *f;
  bool bVar1;
  void *from;
  int64_t iVar2;
  undefined1 local_4c [8];
  upb_MiniTableField field;
  int64_t ret;
  int64_t default_val;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  int64_t *local_20;
  upb_MiniTableField *local_18;
  protobuf_test_messages_proto2_TestAllTypesProto2 *local_10;
  int64_t iVar3;
  
  ret = 0;
  local_4c._0_4_ = 6;
  local_4c._4_2_ = 0x118;
  local_4c._6_2_ = 0x45;
  field.number_dont_copy_me__upb_internal_use_only = 0xc212ffff;
  local_18 = (upb_MiniTableField *)local_4c;
  local_20 = &ret;
  msg_local = (protobuf_test_messages_proto2_TestAllTypesProto2 *)
              &field.offset_dont_copy_me__upb_internal_use_only;
  default_val = (int64_t)msg;
  local_10 = msg;
  bVar1 = upb_MiniTableField_IsExtension(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof(local_18);
  if (((bVar1) ||
      (bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(local_18,local_20)
      , !bVar1)) &&
     (bVar1 = upb_Message_HasBaseField(&local_10->base_dont_copy_me__upb_internal_use_only,local_18)
     , !bVar1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
    iVar3._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
    iVar3._2_2_ = field.presence;
    iVar3._4_2_ = field.submsg_index_dont_copy_me__upb_internal_use_only;
    iVar3._6_1_ = field.descriptortype_dont_copy_me__upb_internal_use_only;
    iVar3._7_1_ = field.mode_dont_copy_me__upb_internal_use_only;
    return iVar3;
  }
  f = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&local_10->base_dont_copy_me__upb_internal_use_only,local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,from);
  iVar2._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
  iVar2._2_2_ = field.presence;
  iVar2._4_2_ = field.submsg_index_dont_copy_me__upb_internal_use_only;
  iVar2._6_1_ = field.descriptortype_dont_copy_me__upb_internal_use_only;
  iVar2._7_1_ = field.mode_dont_copy_me__upb_internal_use_only;
  return iVar2;
}

Assistant:

UPB_INLINE int64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_sint64(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  int64_t default_val = (int64_t)0ll;
  int64_t ret;
  const upb_MiniTableField field = {6, UPB_SIZE(520, 280), 69, kUpb_NoSub, 18, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_8Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}